

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

jsgf_rule_t * jsgf_define_rule(jsgf_t *jsgf,char *name,jsgf_rhs_t *rhs,int is_public)

{
  char *__s;
  size_t sVar1;
  jsgf_rule_t *val;
  char *pcVar2;
  jsgf_rule_t *pjVar3;
  char *pcVar4;
  
  if (name == (char *)0x0) {
    sVar1 = strlen(jsgf->name);
    __s = (char *)__ckd_malloc__(sVar1 + 0x10,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                 ,0x275);
    sprintf(__s,"<%s.g%05d>",jsgf->name,(ulong)(uint)jsgf->rules->inuse);
  }
  else {
    __s = jsgf_fullname(jsgf,name);
  }
  val = (jsgf_rule_t *)
        __ckd_calloc__(1,0x28,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                       ,0x280);
  val->refcnt = 1;
  pcVar2 = __ckd_salloc__(__s,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x282);
  val->name = pcVar2;
  val->rhs = rhs;
  val->is_public = is_public;
  pcVar4 = "PUBLIC ";
  if (is_public == 0) {
    pcVar4 = "";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
          ,0x287,"Defined rule: %s%s\n",pcVar4,pcVar2);
  pjVar3 = (jsgf_rule_t *)hash_table_enter(jsgf->rules,__s,val);
  if (pjVar3 != val) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x28a,"Multiply defined symbol: %s\n",__s);
  }
  return val;
}

Assistant:

jsgf_rule_t *
jsgf_define_rule(jsgf_t * jsgf, char *name, jsgf_rhs_t * rhs,
                 int is_public)
{
    jsgf_rule_t *rule;
    void *val;

    if (name == NULL) {
        name = ckd_malloc(strlen(jsgf->name) + 16);
        sprintf(name, "<%s.g%05d>", jsgf->name,
                hash_table_inuse(jsgf->rules));
    }
    else {
        char *newname;

        newname = jsgf_fullname(jsgf, name);
        name = newname;
    }

    rule = ckd_calloc(1, sizeof(*rule));
    rule->refcnt = 1;
    rule->name = ckd_salloc(name);
    rule->rhs = rhs;
    rule->is_public = is_public;

    E_INFO("Defined rule: %s%s\n",
           rule->is_public ? "PUBLIC " : "", rule->name);
    val = hash_table_enter(jsgf->rules, name, rule);
    if (val != (void *) rule) {
        E_WARN("Multiply defined symbol: %s\n", name);
    }
    return rule;
}